

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::MetaVariable::~MetaVariable(MetaVariable *this)

{
  vtable_type *pvVar1;
  
  ::std::__cxx11::string::~string((string *)&this->_name);
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    (*pvVar1->destroy)((storage_union *)this);
    (this->_value).v_.vtable = (vtable_type *)0x0;
  }
  return;
}

Assistant:

MetaVariable &operator=(const MetaVariable &rhs) {
    _name = rhs._name;
    _value = rhs._value;

    return *this;
  }